

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O0

int pt_iscache_find(pt_image_section_cache *iscache,char *filename,uint64_t offset,uint64_t size,
                   uint64_t laddr)

{
  int iVar1;
  int isid;
  int errcode;
  uint64_t laddr_local;
  uint64_t size_local;
  uint64_t offset_local;
  char *filename_local;
  pt_image_section_cache *iscache_local;
  
  iscache_local._4_4_ = pt_iscache_lock(iscache);
  if (-1 < iscache_local._4_4_) {
    iscache_local._4_4_ = pt_iscache_find_locked(iscache,filename,offset,size,laddr);
    iVar1 = pt_iscache_unlock(iscache);
    if (iVar1 < 0) {
      iscache_local._4_4_ = iVar1;
    }
  }
  return iscache_local._4_4_;
}

Assistant:

int pt_iscache_find(struct pt_image_section_cache *iscache,
		    const char *filename, uint64_t offset, uint64_t size,
		    uint64_t laddr)
{
	int errcode, isid;

	errcode = pt_iscache_lock(iscache);
	if (errcode < 0)
		return errcode;

	isid = pt_iscache_find_locked(iscache, filename, offset, size, laddr);

	errcode = pt_iscache_unlock(iscache);
	if (errcode < 0)
		return errcode;

	return isid;
}